

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3DbExec(int *pRc,sqlite3 *db,char *zFormat,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  int *in_RDI;
  char **in_XMM1_Qa;
  void *in_XMM1_Qb;
  sqlite3_callback in_XMM2_Qa;
  char *in_XMM2_Qb;
  sqlite3 *in_XMM3_Qa;
  __va_list_tag *in_XMM4_Qb;
  char *in_XMM5_Qa;
  char *zSql;
  va_list ap;
  char **in_stack_ffffffffffffff48;
  void *in_stack_ffffffffffffff50;
  sqlite3_callback in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  sqlite3 *in_stack_ffffffffffffff68;
  __va_list_tag *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff48 = in_XMM1_Qa;
    in_stack_ffffffffffffff50 = in_XMM1_Qb;
    in_stack_ffffffffffffff58 = in_XMM2_Qa;
    in_stack_ffffffffffffff60 = in_XMM2_Qb;
    in_stack_ffffffffffffff68 = in_XMM3_Qa;
    in_stack_ffffffffffffff80 = in_XMM4_Qb;
    in_stack_ffffffffffffff88 = in_XMM5_Qa;
  }
  if (*in_RDI == 0) {
    pcVar2 = sqlite3_vmprintf(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    if (pcVar2 == (char *)0x0) {
      *in_RDI = 7;
    }
    else {
      iVar1 = sqlite3_exec(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                           in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                           in_stack_ffffffffffffff48);
      *in_RDI = iVar1;
      sqlite3_free((void *)0x1be136);
    }
  }
  return;
}

Assistant:

static void fts3DbExec(
  int *pRc,              /* Success code */
  sqlite3 *db,           /* Database in which to run SQL */
  const char *zFormat,   /* Format string for SQL */
  ...                    /* Arguments to the format string */
){
  va_list ap;
  char *zSql;
  if( *pRc ) return;
  va_start(ap, zFormat);
  zSql = sqlite3_vmprintf(zFormat, ap);
  va_end(ap);
  if( zSql==0 ){
    *pRc = SQLITE_NOMEM;
  }else{
    *pRc = sqlite3_exec(db, zSql, 0, 0, 0);
    sqlite3_free(zSql);
  }
}